

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void identPut(char *z,int *pIdx,char *zSignedIdent)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int n;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  int id;
  int local_3c;
  int *local_38;
  
  iVar5 = *pIdx;
  uVar7 = (ulong)(byte)*zSignedIdent;
  local_38 = pIdx;
  if (uVar7 == 0) {
    bVar2 = false;
    n = 0;
LAB_0016497e:
    local_3c = 0x1b;
    keywordCode(zSignedIdent,n,&local_3c);
    if (((!bVar2) && (n != 0)) && (local_3c == 0x1b)) {
      bVar2 = false;
      goto LAB_001649b8;
    }
  }
  else {
    lVar6 = 0;
    uVar4 = uVar7;
    do {
      bVar2 = (char)uVar4 != '_' && (""[uVar4] & 6) == 0;
      if (bVar2) break;
      lVar3 = lVar6 + 1;
      uVar4 = (ulong)(byte)zSignedIdent[lVar3];
      lVar6 = lVar6 + 1;
    } while (zSignedIdent[lVar3] != 0);
    n = (int)lVar6;
    if (uVar7 - 0x3a < 0xfffffffffffffff6) goto LAB_0016497e;
  }
  lVar6 = (long)iVar5;
  iVar5 = iVar5 + 1;
  z[lVar6] = '\"';
  uVar7 = (ulong)(byte)*zSignedIdent;
  bVar2 = true;
LAB_001649b8:
  if ((char)uVar7 != '\0') {
    pbVar8 = (byte *)(zSignedIdent + 1);
    do {
      z[iVar5] = (char)uVar7;
      uVar4 = (long)iVar5 + 1;
      if (pbVar8[-1] == 0x22) {
        z[uVar4] = '\"';
        uVar4 = (ulong)(iVar5 + 2);
      }
      bVar1 = *pbVar8;
      uVar7 = (ulong)bVar1;
      pbVar8 = pbVar8 + 1;
      iVar5 = (int)uVar4;
    } while (bVar1 != 0);
  }
  if (bVar2) {
    lVar6 = (long)iVar5;
    iVar5 = iVar5 + 1;
    z[lVar6] = '\"';
  }
  z[iVar5] = '\0';
  *local_38 = iVar5;
  return;
}

Assistant:

static void identPut(char *z, int *pIdx, char *zSignedIdent){
  unsigned char *zIdent = (unsigned char*)zSignedIdent;
  int i, j, needQuote;
  i = *pIdx;

  for(j=0; zIdent[j]; j++){
    if( !sqlite3Isalnum(zIdent[j]) && zIdent[j]!='_' ) break;
  }
  needQuote = sqlite3Isdigit(zIdent[0])
            || sqlite3KeywordCode(zIdent, j)!=TK_ID
            || zIdent[j]!=0
            || j==0;

  if( needQuote ) z[i++] = '"';
  for(j=0; zIdent[j]; j++){
    z[i++] = zIdent[j];
    if( zIdent[j]=='"' ) z[i++] = '"';
  }
  if( needQuote ) z[i++] = '"';
  z[i] = 0;
  *pIdx = i;
}